

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

bool __thiscall
clickhouse::ColumnFixedString::Load(ColumnFixedString *this,CodedInputStream *input,size_t rows)

{
  bool bVar1;
  ulong in_RDX;
  string s;
  size_t i;
  value_type *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string local_48 [32];
  ulong local_28;
  ulong local_20;
  byte local_1;
  
  local_20 = in_RDX;
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    std::__cxx11::string::string(local_48);
    std::__cxx11::string::resize((ulong)local_48);
    std::__cxx11::string::operator[]((ulong)local_48);
    std::__cxx11::string::size();
    bVar1 = WireFormat::ReadBytes
                      ((CodedInputStream *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78,0x2359d8);
    in_stack_ffffffffffffff87 = bVar1;
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(bVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    }
    else {
      local_1 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (!bVar1) goto LAB_00235a64;
  }
  local_1 = 1;
LAB_00235a64:
  return (bool)(local_1 & 1);
}

Assistant:

bool ColumnFixedString::Load(CodedInputStream* input, size_t rows) {
    for (size_t i = 0; i < rows; ++i) {
        std::string s;
        s.resize(string_size_);

        if (!WireFormat::ReadBytes(input, &s[0], s.size())) {
            return false;
        }

        data_.push_back(std::move(s));
    }

    return true;
}